

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O3

hrgls_Status __thiscall
hrgls::API::SetLogMessageCallback(API *this,LogMessageCallback callback,void *userdata)

{
  list<hrgls::Message,_std::allocator<hrgls::Message>_> *this_00;
  API_private *pAVar1;
  uint uVar2;
  undefined1 uVar3;
  long *plVar4;
  mutex *pmVar5;
  
  uVar3 = SUB81(callback,0);
  if (this->m_private == (API_private *)0x0) {
    return 0x3ee;
  }
  pmVar5 = &this->m_private->callbackMutex;
  uVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar5);
  if (uVar2 == 0) {
    pAVar1 = this->m_private;
    pAVar1->callbackHandler = callback;
    pAVar1->callbackUserData = userdata;
    pthread_mutex_unlock((pthread_mutex_t *)pmVar5);
    pmVar5 = &this->m_private->storedMessagesMutex;
    uVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar5);
    if (uVar2 == 0) {
      pAVar1 = this->m_private;
      this_00 = &pAVar1->storedMessages;
      std::__cxx11::_List_base<hrgls::Message,_std::allocator<hrgls::Message>_>::_M_clear
                (&this_00->super__List_base<hrgls::Message,_std::allocator<hrgls::Message>_>);
      (pAVar1->storedMessages).super__List_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
      (pAVar1->storedMessages).super__List_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
      (pAVar1->storedMessages).super__List_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
      _M_impl._M_node._M_size = 0;
      pthread_mutex_unlock((pthread_mutex_t *)pmVar5);
      return 0;
    }
  }
  plVar4 = (long *)(ulong)uVar2;
  std::__throw_system_error(uVar2);
  if (*plVar4 == 0) {
    return 0x3ee;
  }
  *(undefined1 *)(*plVar4 + 0x59) = uVar3;
  return 0;
}

Assistant:

hrgls_Status API::SetLogMessageCallback(LogMessageCallback callback,
      void *userdata)
  {
      if (!m_private) {
          return hrgls_STATUS_NULL_OBJECT_POINTER;
      }

      // Lock the thread mutices for callback and streaming while we change
      // the state.
      {
        std::lock_guard<std::mutex> lock(m_private->callbackMutex);

        // Set the streaming callback handler.
        m_private->callbackHandler = callback;
        m_private->callbackUserData = userdata;
      }

      // Flush all stored messages.
      std::lock_guard<std::mutex> lock2(m_private->storedMessagesMutex);
      m_private->storedMessages.clear();

      return hrgls_STATUS_OKAY;
  }